

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

char * soplex::LPFgetRowName<double>
                 (SPxLPBase<double> *p_lp,int p_idx,NameSet *p_rnames,char *p_buf,
                 int p_num_written_rows)

{
  bool bVar1;
  SPxRowId SVar2;
  char *pcVar3;
  char *in_RCX;
  long in_RDX;
  uint in_R8D;
  DataKey key;
  DataKey *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  if (in_RDX != 0) {
    SVar2 = SPxLPBase<double>::rId
                      ((SPxLPBase<double> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       in_stack_ffffffffffffffc4);
    iVar4 = SVar2.super_DataKey.info;
    bVar1 = NameSet::has((NameSet *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
    if (bVar1) {
      pcVar3 = NameSet::operator[]((NameSet *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffb8);
      return pcVar3;
    }
  }
  spxSnprintf(in_RCX,0x10,"C%d",(ulong)in_R8D);
  return in_RCX;
}

Assistant:

static const char* LPFgetRowName(
   const SPxLPBase<R>& p_lp,
   int                    p_idx,
   const NameSet*         p_rnames,
   char*                  p_buf,
   int                    p_num_written_rows
)
{
   assert(p_buf != nullptr);
   assert(p_idx >= 0);
   assert(p_idx <  p_lp.nRows());

   if(p_rnames != nullptr)
   {
      DataKey key = p_lp.rId(p_idx);

      if(p_rnames->has(key))
         return (*p_rnames)[key];
   }

   spxSnprintf(p_buf, 16, "C%d", p_num_written_rows);

   return p_buf;
}